

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall
tinyusdz::Attribute::get_value<std::array<tinyusdz::value::half,4ul>>
          (Attribute *this,array<tinyusdz::value::half,_4UL> *v)

{
  value_type *pvVar1;
  optional<std::array<tinyusdz::value::half,_4UL>_> ret;
  optional<std::array<tinyusdz::value::half,_4UL>_> local_2c;
  optional<std::array<tinyusdz::value::half,_4UL>_> local_22;
  
  if (v == (array<tinyusdz::value::half,_4UL> *)0x0) {
    local_2c.has_value_ = false;
  }
  else {
    primvar::PrimVar::get_value<std::array<tinyusdz::value::half,4ul>>(&local_2c,&this->_var);
    local_22.has_value_ = local_2c.has_value_;
    if (local_2c.has_value_ != false) {
      local_22.contained = local_2c.contained;
      pvVar1 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_4UL>_>::value
                         (&local_22);
      *(undefined8 *)v->_M_elems = *(undefined8 *)pvVar1->_M_elems;
    }
  }
  return local_2c.has_value_;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }